

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

void __thiscall
vkt::image::anon_unknown_0::BufferLoadStoreTestInstance::commandBindDescriptorsForLayer
          (BufferLoadStoreTestInstance *this,VkCommandBuffer cmdBuffer,
          VkPipelineLayout pipelineLayout,int layerNdx)

{
  VkDevice device;
  DeviceInterface *vk;
  DescriptorSetUpdateBuilder *pDVar1;
  Location local_88;
  Location local_80;
  DescriptorSetUpdateBuilder local_78;
  
  device = Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                              super_TestInstance.m_context);
  vk = Context::getDeviceInterface
                 ((this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance.
                  m_context);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_78);
  local_80.m_binding = 0;
  local_80.m_arrayElement = 0;
  pDVar1 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (&local_78,
                      (VkDescriptorSet)
                      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      object.m_internal,&local_80,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,
                      (VkBufferView *)&this->m_bufferViewSrc);
  local_88.m_binding = 1;
  local_88.m_arrayElement = 0;
  pDVar1 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar1,(VkDescriptorSet)
                             (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                             m_data.object.m_internal,&local_88,
                      VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,(VkBufferView *)&this->m_bufferViewDst
                     );
  ::vk::DescriptorSetUpdateBuilder::update(pDVar1,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_78);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,cmdBuffer,1,pipelineLayout.m_internal,0,1,&this->m_descriptorSet,0,0);
  return;
}

Assistant:

void BufferLoadStoreTestInstance::commandBindDescriptorsForLayer (const VkCommandBuffer cmdBuffer, const VkPipelineLayout pipelineLayout, const int layerNdx)
{
	DE_ASSERT(layerNdx == 0);
	DE_UNREF(layerNdx);

	const VkDevice			device	= m_context.getDevice();
	const DeviceInterface&	vk		= m_context.getDeviceInterface();

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, &m_bufferViewSrc.get())
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, &m_bufferViewDst.get())
		.update(vk, device);
	vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);
}